

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Histogram.cpp
# Opt level: O1

shared_ptr<Image> __thiscall Histogram::toImage(Histogram *this,uint height_per_channel)

{
  long *plVar1;
  ulong uVar2;
  int y;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  char cVar6;
  uint in_EDX;
  uint uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  uint uVar9;
  undefined4 in_register_00000034;
  Histogram *this_00;
  uint uVar10;
  char cVar11;
  uint uVar12;
  int channel;
  ulong uVar13;
  shared_ptr<Image> sVar14;
  undefined4 local_38;
  undefined1 local_31;
  uint local_30;
  uint local_2c;
  
  this_00 = (Histogram *)CONCAT44(in_register_00000034,height_per_channel);
  local_2c = this_00->range;
  local_30 = this_00->channels * in_EDX;
  this->channels = 0;
  this->range = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Image,std::allocator<Image>,unsigned_int,unsigned_int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->values,(Image **)this,
             (allocator<Image> *)&local_31,&local_2c,&local_30);
  _Var8._M_pi = extraout_RDX;
  if (0 < this_00->channels) {
    uVar9 = in_EDX - 1;
    uVar13 = 0;
    do {
      channel = (int)uVar13;
      uVar3 = max(this_00,channel);
      iVar4 = this_00->range;
      _Var8._M_pi = extraout_RDX_00;
      if (0 < iVar4) {
        uVar10 = 0;
        do {
          cVar6 = (char)(uVar10 >> 1);
          cVar11 = -0x80 - cVar6;
          cVar6 = cVar6 + -0x80;
          local_38 = CONCAT13(0xff,CONCAT12(cVar11,CONCAT11(cVar11,cVar11)));
          if (uVar13 == 3) {
            local_38 = CONCAT13(cVar6,0xffffff);
          }
          *(char *)((long)&local_38 + uVar13) = cVar6;
          if (3 < uVar13) {
            __assert_fail("channel >= 0 && channel < 4",
                          "/workspace/llm4binary/github/license_c_cmakelists/acstud[P]lab2/src/utils/Histogram.hpp"
                          ,0x1f,"int Histogram::operator()(unsigned char, int) const");
          }
          uVar2 = (ulong)((this_00->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[(int)((uVar10 & 0xff) + iVar4 * channel)]
                         * in_EDX);
          uVar5 = uVar2 / uVar3;
          _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar2 % (ulong)uVar3);
          if (0 < (int)uVar5) {
            _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            uVar12 = uVar9;
            do {
              plVar1 = *(long **)this;
              if ((*(uint *)(plVar1 + 4) <= uVar10) || (*(uint *)((long)plVar1 + 0x24) <= uVar12))
              goto LAB_001123d0;
              *(undefined4 *)(*plVar1 + (ulong)(*(uint *)(plVar1 + 4) * uVar12 + uVar10) * 4) =
                   local_38;
              uVar7 = (int)_Var8._M_pi + 1;
              _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar7;
              uVar12 = uVar12 - 1;
            } while ((int)uVar7 < (int)uVar5);
          }
          while (uVar12 = (uint)uVar5, uVar12 < in_EDX) {
            plVar1 = *(long **)this;
            if ((*(uint *)(plVar1 + 4) <= uVar10) ||
               (uVar7 = ~uVar12 + (channel + 1) * in_EDX, *(uint *)((long)plVar1 + 0x24) <= uVar7))
            {
LAB_001123d0:
              __assert_fail("(x < width) && (y < height)",
                            "/workspace/llm4binary/github/license_c_cmakelists/acstud[P]lab2/src/utils/Image.hpp"
                            ,0x3e,"Pixel &Image::operator()(int, int)");
            }
            _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          (ulong)(*(uint *)(plVar1 + 4) * uVar7 + uVar10);
            *(undefined4 *)(*plVar1 + (long)_Var8._M_pi * 4) = 0xff000000;
            uVar5 = (ulong)(uVar12 + 1);
          }
          uVar10 = uVar10 + 1;
          iVar4 = this_00->range;
        } while ((int)uVar10 < iVar4);
      }
      uVar13 = uVar13 + 1;
      uVar9 = uVar9 + in_EDX;
    } while ((long)uVar13 < (long)this_00->channels);
  }
  sVar14.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var8._M_pi;
  sVar14.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Image>)sVar14.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Image> Histogram::toImage(unsigned int height_per_channel) const {
  auto img = std::make_shared<Image>((unsigned int) range, channels * height_per_channel);

  // Create a black background color for the histogram
  Pixel black = {{0, 0, 0, 255}};

  // Loop over all channels
  for (int c = 0; c < channels; c++) {
    // Find the channel maximum value to scale down the bars
    int scale = max(c);
    // Loop over all intensities
    for (int i = 0; i < range; i++) {

      // Create a color for this bar based on intensity position
      auto color = (unsigned char) (128 + i / 2);
      auto inverse = (unsigned char) (128 - i / 2);

      Pixel pixel = {{inverse, inverse, inverse, 255}};

      // If this is the alpha channel, the color should be white and slowly fade out
      if (c == 3) {
        pixel = {{255, 255, 255, color}};
      }

      // Set the actual channel to the color based on intensity
      pixel.colors[c] = color;

      // Figure out the height of the histogram bar, but use dB
      auto bar_height = (int) ((height_per_channel * count((unsigned char) i, c)) / scale);

      // Draw the bar vertically
      for (int y = 0; y < bar_height; y++) {
        int ty = ((c + 1) * height_per_channel - 1) - y;
        img->pixel(i, ty) = pixel;
      }

      // Color the rest of the pixels black
      for (int y = bar_height; y < height_per_channel; y++) {
        int ty = ((c + 1) * height_per_channel - 1) - y;
        img->pixel(i, ty) = black;
      }
    }
  }

  return img;
}